

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O2

long __thiscall
njoy::ENDFtk::section::Type<32,_151>::
CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
::NC(CompactCovarianceBase<njoy::ENDFtk::section::Type<32,_151>::CompactReichMooreUncertainties,_njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_njoy::ENDFtk::section::Type<32,_151>::CompactReichMoore>
     *this)

{
  pointer pdVar1;
  pointer pdVar2;
  ReichMooreScatteringRadiusUncertainties *pRVar3;
  long lVar4;
  long lVar5;
  
  if ((this->dap_).
      super__Optional_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_false,_false>
      ._M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties,_true,_false,_false>
      .
      super__Optional_payload_base<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
      ._M_engaged == true) {
    pRVar3 = std::
             optional<njoy::ENDFtk::section::Type<32,_151>::ReichMooreScatteringRadiusUncertainties>
             ::value(&this->dap_);
    lVar5 = (((long)(pRVar3->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pRVar3->super_ListRecord).data.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 5) / 6 + 3;
  }
  else {
    lVar5 = 2;
  }
  pdVar1 = (this->uncertainties_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pdVar2 = (this->uncertainties_).super_ListRecord.data.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar4 = CompactCorrelationMatrix::NC(&this->matrix_);
  return lVar4 + lVar5 + (((long)pdVar1 - (long)pdVar2 >> 3) + 5) / 6;
}

Assistant:

long NC() const {

  long NC = 1;
  if ( this->ISR() ) { NC += Derived::NC( this->dap_.value() ); }
  NC += this->uncertainties_.NC();
  NC += this->matrix_.NC();
  return NC;
}